

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswCore.c
# Opt level: O2

void Ssw_ReportOutputs(Aig_Man_t *pAig)

{
  char *pcVar1;
  void *pvVar2;
  int i;
  Vec_Ptr_t *p;
  Aig_Man_t *pAVar3;
  
  pAVar3 = pAig;
  for (i = 0; i < pAig->nTruePos; i = i + 1) {
    p = pAig->vCos;
    pvVar2 = Vec_PtrEntry(p,i);
    pcVar1 = "1tPD cq[:P tqS[ [qS& Sq[Vt Sq[c Sq[lt Sq[: VqlSt[ Squ[ tq[P( tq+[P [qDtP( c";
    if (i < pAig->nTruePos - pAig->nConstrs) {
      pcVar1 = "o;# o+& ;#oB a;o& 5;o# o>& o5;#B >&oa Q;o# +Qo& T;o# +To& p;o# p>o& opT;# o";
    }
    Abc_Print((int)p,pcVar1 + 0x4a);
    pAVar3 = pAig;
    Ssw_ReportOneOutput(pAig,*(Aig_Obj_t **)((long)pvVar2 + 8));
  }
  Abc_Print((int)pAVar3,"\n");
  return;
}

Assistant:

void Ssw_ReportOutputs( Aig_Man_t * pAig )
{
    Aig_Obj_t * pObj;
    int i;
    Saig_ManForEachPo( pAig, pObj, i )
    {
        if ( i < Saig_ManPoNum(pAig)-Saig_ManConstrNum(pAig) )
            Abc_Print( 1, "o" );
        else
            Abc_Print( 1, "c" );
        Ssw_ReportOneOutput( pAig, Aig_ObjChild0(pObj) );
    }
    Abc_Print( 1, "\n" );
}